

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_enc_dec.cpp
# Opt level: O3

int transcode(int K,int symSize,string *inputFname,string *outputFname,string *inputEsiStr,
             string *outputEsiStr)

{
  uint32_t uVar1;
  size_type sVar2;
  _Alloc_hider _Var3;
  size_t __size;
  size_t __s;
  size_t sVar4;
  string *psVar5;
  ulong uVar6;
  void *pvVar7;
  uint uVar8;
  uint uVar9;
  void *pvVar10;
  void *pvVar11;
  size_t sVar12;
  uint32_t *puVar13;
  long *plVar14;
  pointer pcVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  uint32_t auStack_550 [2];
  long local_548;
  ifstream ifs;
  byte abStack_528 [488];
  long local_340;
  ofstream ofs;
  byte abStack_320 [216];
  ios_base local_248 [264];
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  size_t local_c0;
  size_t interWorkSize;
  size_t interProgSize;
  size_t iblockSymCnt;
  size_t outWorkSize;
  undefined1 *local_98;
  size_t local_90;
  size_t outProgSize;
  undefined8 local_80;
  ulong local_78;
  void *local_70;
  string *local_68;
  ulong local_60;
  int local_54;
  void *local_50;
  void *local_48;
  void *local_40;
  void *local_38;
  
  local_60 = CONCAT44(local_60._4_4_,K);
  auStack_550[0] = 0x102d3f;
  auStack_550[1] = 0;
  local_68 = outputEsiStr;
  local_54 = symSize;
  std::ifstream::ifstream(&local_548,(string *)inputFname,_S_bin|_S_ate);
  auStack_550[0] = 0x102d47;
  auStack_550[1] = 0;
  local_80 = std::istream::tellg();
  auStack_550[0] = 0x102d5b;
  auStack_550[1] = 0;
  std::istream::seekg((long)&local_548,_S_beg);
  auStack_550[0] = 0x102d6f;
  auStack_550[1] = 0;
  std::ofstream::ofstream(&local_340,(string *)outputFname,_S_bin);
  if ((abStack_528[*(long *)(local_548 + -0x18)] & 5) == 0) {
    if ((abStack_320[*(long *)(local_340 + -0x18)] & 5) == 0) {
      pcVar15 = (inputEsiStr->_M_dataplus)._M_p;
      auStack_550[0] = 0x102dc4;
      auStack_550[1] = 0;
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_140,pcVar15,pcVar15 + inputEsiStr->_M_string_length);
      auStack_550[0] = 0x102dd0;
      auStack_550[1] = 0;
      uVar8 = getESICnt(&local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        auStack_550[0] = 0x102dee;
        auStack_550[1] = 0;
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      local_78 = (ulong)(uVar8 * local_54);
      local_70 = (void *)((long)&local_548 - (local_78 + 0xf & 0xfffffffffffffff0));
      puVar13 = (uint32_t *)((long)local_70 - ((ulong)uVar8 * 4 + 0xf & 0xfffffffffffffff0));
      pcVar15 = (inputEsiStr->_M_dataplus)._M_p;
      sVar2 = inputEsiStr->_M_string_length;
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      local_98 = (undefined1 *)&local_548;
      puVar13[-2] = 0x102e50;
      puVar13[-1] = 0;
      std::__cxx11::string::_M_construct<char*>((string *)&local_120,pcVar15,pcVar15 + sVar2);
      puVar13[-2] = 0x102e5f;
      puVar13[-1] = 0;
      parseESIStr(&local_120,(int)pcVar15,puVar13);
      _Var3._M_p = local_120._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        puVar13[-2] = 0x102e7a;
        puVar13[-1] = 0;
        operator_delete(_Var3._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      uVar16 = local_60 & 0xffffffff;
      iVar18 = uVar8 - (int)local_60;
      puVar13[-2] = 0x102ea0;
      puVar13[-1] = 0;
      uVar9 = RqInterGetMemSizes(uVar16,iVar18,&local_c0,&interWorkSize,&interProgSize);
      if (uVar9 == 0) {
        puVar13[-2] = 0x102eb7;
        puVar13[-1] = 0;
        pvVar10 = malloc(local_c0);
        uVar16 = local_60 & 0xffffffff;
        local_50 = pvVar10;
        puVar13[-2] = 0x102ecc;
        puVar13[-1] = 0;
        iVar18 = RqInterInit(uVar16,iVar18,pvVar10,local_c0);
        if (iVar18 == 0) {
          if (0 < (int)uVar8) {
            uVar16 = 0;
            do {
              pvVar10 = local_50;
              uVar1 = puVar13[uVar16];
              puVar13[-2] = 0x102eee;
              puVar13[-1] = 0;
              RqInterAddIds(pvVar10,uVar1,1);
              uVar16 = uVar16 + 1;
            } while (uVar8 != uVar16);
          }
          puVar13[-2] = 0x102f05;
          puVar13[-1] = 0;
          pvVar11 = malloc(interWorkSize);
          pvVar10 = local_50;
          local_38 = pvVar11;
          puVar13[-2] = 0x102f1b;
          puVar13[-1] = 0;
          iVar18 = RqInterCompile(pvVar10,pvVar11,interWorkSize);
          psVar5 = local_68;
          if (iVar18 == 0) {
            pcVar15 = (local_68->_M_dataplus)._M_p;
            sVar2 = local_68->_M_string_length;
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            puVar13[-2] = 0x102f48;
            puVar13[-1] = 0;
            std::__cxx11::string::_M_construct<char*>((string *)&local_100,pcVar15,pcVar15 + sVar2);
            puVar13[-2] = 0x102f54;
            puVar13[-1] = 0;
            uVar8 = getESICnt(&local_100);
            _Var3._M_p = local_100._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              puVar13[-2] = 0x102f72;
              puVar13[-1] = 0;
              operator_delete(_Var3._M_p,local_100.field_2._M_allocated_capacity + 1);
            }
            puVar13 = (uint32_t *)((long)puVar13 - ((ulong)uVar8 * 4 + 0xf & 0xfffffffffffffff0));
            pcVar15 = (psVar5->_M_dataplus)._M_p;
            sVar2 = psVar5->_M_string_length;
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            puVar13[-2] = 0x102fab;
            puVar13[-1] = 0;
            std::__cxx11::string::_M_construct<char*>((string *)&local_e0,pcVar15,pcVar15 + sVar2);
            puVar13[-2] = 0x102fba;
            puVar13[-1] = 0;
            parseESIStr(&local_e0,(int)pcVar15,puVar13);
            _Var3._M_p = local_e0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              puVar13[-2] = 0x102fd5;
              puVar13[-1] = 0;
              operator_delete(_Var3._M_p,local_e0.field_2._M_allocated_capacity + 1);
            }
            local_68 = (string *)(ulong)(uVar8 * local_54);
            sVar12 = (long)puVar13 -
                     ((ulong)((long)&local_68->_M_string_length + 7U) & 0xfffffffffffffff0);
            outProgSize = sVar12;
            *(undefined8 *)(sVar12 - 8) = 0x10300b;
            iVar18 = RqOutGetMemSizes(uVar8,&iblockSymCnt,&local_90);
            if (iVar18 == 0) {
              *(undefined8 *)(sVar12 - 8) = 0x103025;
              pvVar10 = malloc(iblockSymCnt);
              __size = local_90;
              *(undefined8 *)(sVar12 - 8) = 0x103034;
              local_40 = malloc(__size);
              uVar16 = local_60 & 0xffffffff;
              local_48 = pvVar10;
              *(undefined8 *)(sVar12 - 8) = 0x10304a;
              uVar9 = RqOutInit(uVar16,pvVar10,iblockSymCnt);
              if (uVar9 == 0) {
                if (0 < (int)uVar8) {
                  uVar16 = 0;
                  do {
                    pvVar10 = local_48;
                    uVar1 = puVar13[uVar16];
                    *(undefined8 *)(sVar12 - 8) = 0x10306b;
                    uVar9 = RqOutAddIds(pvVar10,uVar1,1);
                    if (uVar9 != 0) {
                      *(undefined8 *)(sVar12 - 8) = 0x103444;
                      fprintf(_stderr,"Error:%s:%d:  %s failed: %d\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
                              ,0xdf,"RqOutAddIds(outWork, ESIs_wanted[i], 1)",(ulong)uVar9);
                      pvVar10 = local_38;
                      if (local_38 != (void *)0x0) {
                        *(undefined8 *)(sVar12 - 8) = 0x103452;
                        free(pvVar10);
                      }
                      pvVar11 = local_48;
                      pvVar10 = local_50;
                      if (local_50 != (void *)0x0) {
                        *(undefined8 *)(sVar12 - 8) = 0x103464;
                        free(pvVar10);
                      }
                      if (pvVar11 != (void *)0x0) {
                        *(undefined8 *)(sVar12 - 8) = 0x103471;
                        free(pvVar11);
                      }
                      pvVar10 = local_40;
                      if (local_40 != (void *)0x0) {
                        *(undefined8 *)(sVar12 - 8) = 0x10347f;
                        free(pvVar10);
                      }
                      *(undefined8 *)(sVar12 - 8) = 0x10348b;
                      std::ifstream::close();
                      *(undefined8 *)(sVar12 - 8) = 0x103497;
                      std::ofstream::close();
                      goto LAB_0010364f;
                    }
                    uVar16 = uVar16 + 1;
                  } while (uVar8 != uVar16);
                }
                pvVar11 = local_40;
                pvVar10 = local_48;
                *(undefined8 *)(sVar12 - 8) = 0x10308f;
                uVar8 = RqOutCompile(pvVar10,pvVar11,local_90);
                pvVar10 = local_50;
                psVar5 = local_68;
                __s = outProgSize;
                if (uVar8 == 0) {
                  if (0 < (int)local_80) {
                    outWorkSize = (size_t)(int)local_78;
                    local_60 = (ulong)local_54;
                    iVar18 = 0;
                    do {
                      pvVar11 = local_70;
                      uVar16 = local_78;
                      if (0 < (int)local_78) {
                        *(undefined8 *)(sVar12 - 8) = 0x1030d8;
                        memset(pvVar11,0,uVar16);
                      }
                      pvVar11 = local_70;
                      *(undefined8 *)(sVar12 - 8) = 0x1030f2;
                      std::istream::read((char *)&local_548,(long)pvVar11);
                      pvVar7 = local_38;
                      uVar6 = local_60;
                      pvVar11 = local_70;
                      uVar16 = local_78;
                      if ((abStack_528[*(long *)(local_548 + -0x18)] & 5) != 0) {
                        *(undefined8 *)(sVar12 - 8) = 0x1034c7;
                        fprintf(_stderr,"Error: %s:%d: Unable to read enough bytes from file: %ld\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
                                ,0xec,_ifs);
                        pvVar11 = local_38;
                        if (local_38 != (void *)0x0) {
                          *(undefined8 *)(sVar12 - 8) = 0x1034d5;
                          free(pvVar11);
                        }
                        if (pvVar10 != (void *)0x0) {
                          *(undefined8 *)(sVar12 - 8) = 0x1034e2;
                          free(pvVar10);
                        }
                        pvVar10 = local_48;
                        if (local_48 != (void *)0x0) {
                          *(undefined8 *)(sVar12 - 8) = 0x1034f0;
                          free(pvVar10);
                        }
                        pvVar10 = local_40;
                        if (local_40 != (void *)0x0) {
                          *(undefined8 *)(sVar12 - 8) = 0x1034fe;
                          free(pvVar10);
                        }
                        *(undefined8 *)(sVar12 - 8) = 0x10350a;
                        std::ifstream::close();
                        *(undefined8 *)(sVar12 - 8) = 0x103516;
                        std::ofstream::close();
                        goto LAB_0010364f;
                      }
                      lVar17 = sVar12 - (interProgSize * local_60 + 0xf & 0xfffffffffffffff0);
                      *(undefined8 *)(lVar17 + -8) = 0x103142;
                      uVar8 = RqInterExecute(pvVar7,uVar6,pvVar11,uVar16,lVar17);
                      if (uVar8 != 0) {
                        *(undefined8 *)(lVar17 + -8) = 0x103549;
                        fprintf(_stderr,"Error:%s:%d:  %s failed: %d\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
                                ,0xfb,
                                "RqInterExecute(interProgram, symSize, src, sizeof(src), iblock, sizeof(iblock))"
                                ,(ulong)uVar8);
                        pvVar10 = local_38;
                        if (local_38 != (void *)0x0) {
                          *(undefined8 *)(lVar17 + -8) = 0x103557;
                          free(pvVar10);
                        }
                        pvVar11 = local_48;
                        pvVar10 = local_50;
                        if (local_50 != (void *)0x0) {
                          *(undefined8 *)(lVar17 + -8) = 0x103569;
                          free(pvVar10);
                        }
                        if (pvVar11 != (void *)0x0) {
                          *(undefined8 *)(lVar17 + -8) = 0x103576;
                          free(pvVar11);
                        }
                        pvVar10 = local_40;
                        if (local_40 != (void *)0x0) {
                          *(undefined8 *)(lVar17 + -8) = 0x103584;
                          free(pvVar10);
                        }
                        *(undefined8 *)(lVar17 + -8) = 0x103590;
                        std::ifstream::close();
                        *(undefined8 *)(lVar17 + -8) = 0x10359c;
                        std::ofstream::close();
                        goto LAB_0010364f;
                      }
                      *(undefined8 *)(lVar17 + -8) = 0x103157;
                      memset((void *)__s,0,(size_t)psVar5);
                      pvVar10 = local_40;
                      uVar16 = local_60;
                      *(undefined8 *)(lVar17 + -8) = 0x10316d;
                      uVar8 = RqOutExecute(pvVar10,uVar16,lVar17,__s,psVar5);
                      pvVar10 = local_50;
                      sVar4 = outProgSize;
                      if (uVar8 != 0) {
                        *(undefined8 *)(lVar17 + -8) = 0x1035cf;
                        fprintf(_stderr,"Error:%s:%d:  %s failed: %d\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
                                ,0x103,"RqOutExecute(outProgram, symSize, iblock, enc, sizeof(enc))"
                                ,(ulong)uVar8);
                        pvVar11 = local_38;
                        if (local_38 != (void *)0x0) {
                          *(undefined8 *)(lVar17 + -8) = 0x1035dd;
                          free(pvVar11);
                        }
                        if (pvVar10 != (void *)0x0) {
                          *(undefined8 *)(lVar17 + -8) = 0x1035ea;
                          free(pvVar10);
                        }
                        pvVar10 = local_48;
                        if (local_48 != (void *)0x0) {
                          *(undefined8 *)(lVar17 + -8) = 0x1035f8;
                          free(pvVar10);
                        }
                        pvVar10 = local_40;
                        if (local_40 != (void *)0x0) {
                          *(undefined8 *)(lVar17 + -8) = 0x103606;
                          free(pvVar10);
                        }
                        *(undefined8 *)(lVar17 + -8) = 0x103612;
                        std::ifstream::close();
                        *(undefined8 *)(lVar17 + -8) = 0x10361e;
                        std::ofstream::close();
                        goto LAB_0010364f;
                      }
                      *(undefined8 *)(lVar17 + -8) = 0x10318d;
                      std::ostream::write((char *)&local_340,sVar4);
                      if (*(int *)(abStack_320 + *(long *)(local_340 + -0x18)) != 0) {
                        *(undefined8 *)(lVar17 + -8) = 0x103634;
                        transcode();
                        *(undefined8 *)(lVar17 + -8) = 0x103640;
                        std::ifstream::close();
                        *(undefined8 *)(lVar17 + -8) = 0x10364c;
                        std::ofstream::close();
                        goto LAB_0010364f;
                      }
                      iVar18 = iVar18 + (int)local_78;
                    } while (iVar18 < (int)local_80);
                  }
                  pvVar11 = local_38;
                  if (local_38 != (void *)0x0) {
                    *(undefined8 *)(sVar12 - 8) = 0x1031cc;
                    free(pvVar11);
                  }
                  if (pvVar10 != (void *)0x0) {
                    *(undefined8 *)(sVar12 - 8) = 0x1031d9;
                    free(pvVar10);
                  }
                  pvVar10 = local_48;
                  if (local_48 != (void *)0x0) {
                    *(undefined8 *)(sVar12 - 8) = 0x1031e7;
                    free(pvVar10);
                  }
                  pvVar10 = local_40;
                  if (local_40 != (void *)0x0) {
                    *(undefined8 *)(sVar12 - 8) = 0x1031f5;
                    free(pvVar10);
                  }
                  *(undefined8 *)(sVar12 - 8) = 0x103201;
                  std::ifstream::close();
                  iVar18 = 1;
                  *(undefined8 *)(sVar12 - 8) = 0x103212;
                  std::ofstream::close();
                  plVar14 = (long *)local_98;
                  goto LAB_00103658;
                }
                *(undefined8 *)(sVar12 - 8) = 0x1033c2;
                fprintf(_stderr,"Error:%s:%d:  %s failed: %d\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
                        ,0xe0,"RqOutCompile(outWork, outProgram, outProgSize)",(ulong)uVar8);
                pvVar11 = local_38;
                if (local_38 != (void *)0x0) {
                  *(undefined8 *)(sVar12 - 8) = 0x1033d0;
                  free(pvVar11);
                }
                if (pvVar10 != (void *)0x0) {
                  *(undefined8 *)(sVar12 - 8) = 0x1033dd;
                  free(pvVar10);
                }
                pvVar10 = local_48;
                if (local_48 != (void *)0x0) {
                  *(undefined8 *)(sVar12 - 8) = 0x1033eb;
                  free(pvVar10);
                }
                pvVar10 = local_40;
                if (local_40 != (void *)0x0) {
                  *(undefined8 *)(sVar12 - 8) = 0x1033f9;
                  free(pvVar10);
                }
                *(undefined8 *)(sVar12 - 8) = 0x103405;
                std::ifstream::close();
                *(undefined8 *)(sVar12 - 8) = 0x103411;
                std::ofstream::close();
              }
              else {
                *(undefined8 *)(sVar12 - 8) = 0x10333c;
                fprintf(_stderr,"Error:%s:%d:  %s failed: %d\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
                        ,0xdd,"RqOutInit(K, outWork, outWorkSize)",(ulong)uVar9);
                pvVar10 = local_38;
                if (local_38 != (void *)0x0) {
                  *(undefined8 *)(sVar12 - 8) = 0x10334a;
                  free(pvVar10);
                }
                pvVar11 = local_48;
                pvVar10 = local_50;
                if (local_50 != (void *)0x0) {
                  *(undefined8 *)(sVar12 - 8) = 0x10335c;
                  free(pvVar10);
                }
                if (pvVar11 != (void *)0x0) {
                  *(undefined8 *)(sVar12 - 8) = 0x103369;
                  free(pvVar11);
                }
                pvVar10 = local_40;
                if (local_40 != (void *)0x0) {
                  *(undefined8 *)(sVar12 - 8) = 0x103377;
                  free(pvVar10);
                }
                *(undefined8 *)(sVar12 - 8) = 0x103383;
                std::ifstream::close();
                *(undefined8 *)(sVar12 - 8) = 0x10338f;
                std::ofstream::close();
              }
            }
            else {
              *(undefined8 *)(sVar12 - 8) = 0x1032f1;
              transcode();
              *(undefined8 *)(sVar12 - 8) = 0x1032fd;
              std::ifstream::close();
              *(undefined8 *)(sVar12 - 8) = 0x103309;
              std::ofstream::close();
            }
          }
          else {
            puVar13[-2] = 0x1032c5;
            puVar13[-1] = 0;
            transcode();
            puVar13[-2] = 0x1032d1;
            puVar13[-1] = 0;
            std::ifstream::close();
            puVar13[-2] = 0x1032dd;
            puVar13[-1] = 0;
            std::ofstream::close();
          }
        }
        else {
          puVar13[-2] = 0x10329a;
          puVar13[-1] = 0;
          transcode();
          puVar13[-2] = 0x1032a6;
          puVar13[-1] = 0;
          std::ifstream::close();
          puVar13[-2] = 0x1032b2;
          puVar13[-1] = 0;
          std::ofstream::close();
        }
LAB_0010364f:
        iVar18 = 0;
        plVar14 = (long *)local_98;
      }
      else {
        iVar18 = 0;
        puVar13[-2] = 0x103272;
        puVar13[-1] = 0;
        fprintf(_stderr,"Error:%s:%d:  %s failed: %d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
                ,0xc5,"RqInterGetMemSizes(K, nExtra, &interWorkSize, &interProgSize, &iblockSymCnt)"
                ,(ulong)uVar9);
        puVar13[-2] = 0x10327e;
        puVar13[-1] = 0;
        std::ifstream::close();
        puVar13[-2] = 0x10328a;
        puVar13[-1] = 0;
        std::ofstream::close();
        plVar14 = (long *)local_98;
      }
      goto LAB_00103658;
    }
    auStack_550[0] = 0x103223;
    auStack_550[1] = 0;
    transcode();
  }
  else {
    auStack_550[0] = 0x10321c;
    auStack_550[1] = 0;
    transcode();
  }
  auStack_550[0] = 0x10322f;
  auStack_550[1] = 0;
  std::ifstream::close();
  iVar18 = 0;
  auStack_550[0] = 0x10323d;
  auStack_550[1] = 0;
  std::ofstream::close();
  plVar14 = &local_548;
LAB_00103658:
  local_340 = _VTT;
  *(undefined8 *)((long)&local_340 + *(long *)(_VTT + -0x18)) = _VTT;
  *(undefined8 *)((long)plVar14 + -8) = 0x103682;
  std::filebuf::~filebuf((filebuf *)&ofs);
  *(undefined8 *)((long)plVar14 + -8) = 0x10368e;
  std::ios_base::~ios_base(local_248);
  *(undefined8 *)((long)plVar14 + -8) = 0x10369a;
  std::ifstream::~ifstream(&local_548);
  return iVar18;
}

Assistant:

int transcode(int K, int symSize, string inputFname, string outputFname, string inputEsiStr,
              string outputEsiStr)
{
    int status = 0;

    RqInterWorkMem* interWork = NULL;
    RqInterProgram* interProgram = NULL;
    RqOutWorkMem*   outWork = NULL;
    RqOutProgram*   outProgram = NULL;

    /* Open input and output files */
    ifstream ifs(inputFname, ios::binary|ios::ate);
    int length = ifs.tellg();
    ifs.seekg(0, ios::beg);

    ofstream ofs(outputFname, ios::binary);

#define DONE()                                                  \
    do {                                                        \
        if (interProgram)    free(interProgram);                \
        if (interWork)       free(interWork);                   \
        if (outWork)         free(outWork);                     \
        if (outProgram)      free(outProgram);                  \
        ifs.close();                                            \
        ofs.close();                                            \
        if (status == 0) return true; else return false;        \
    } while(0);
#define RUN_NOFAIL(x)   RUN_NOFAIL__INT(x, RUN_NOFAIL__err)
#define RUN_NOFAIL__INT(x,           err)                       \
    do {                                                        \
        int err;                                                \
        if ((err = (x)) != 0) {                                 \
            fprintf(stderr, "Error:%s:%d:  %s failed: %d\n",    \
                    __FILE__, __LINE__, #x, err);               \
            status = err;                                       \
            DONE();                                             \
        }                                                       \
    } while(0)

    if (!ifs ) {
        fprintf(stderr,  "Error:%s:%d: Unable to open input file\n",
                __FILE__, __LINE__);

        status = 1;
        DONE();
    }

    if (!ofs ) {
        fprintf(stderr,  "Error:%s:%d: Unable to open output file\n",
                __FILE__, __LINE__);

        status = 1;
        DONE();
    }

    /* Setup src block */
    int inputEsiCnt = getESICnt(inputEsiStr);
    uint8_t src[inputEsiCnt * symSize];

    uint32_t ESIs_input[inputEsiCnt];
    parseESIStr(inputEsiStr, inputEsiCnt, ESIs_input);

    size_t interWorkSize, interProgSize, iblockSymCnt;

    /* Get various memory sizes from RQ API */
    const int nExtra = inputEsiCnt - K;
    RUN_NOFAIL(RqInterGetMemSizes(K,
                                nExtra,
                                &interWorkSize,
                                &interProgSize,
                                &iblockSymCnt));

    /* Create encoding interProgram */
    interWork = (RqInterWorkMem* )malloc(interWorkSize);
    RUN_NOFAIL(RqInterInit(K, nExtra, interWork, interWorkSize));
    for (int i = 0; i < inputEsiCnt; ++i) {
        RqInterAddIds(interWork, ESIs_input[i], 1);
    }

    interProgram = (RqInterProgram*)malloc(interProgSize);
    RUN_NOFAIL(RqInterCompile(interWork, interProgram, interProgSize));

    /* Setup enc block */
    int outputEsiCnt = getESICnt(outputEsiStr);
    uint32_t ESIs_wanted[outputEsiCnt];

    parseESIStr(outputEsiStr, outputEsiCnt, ESIs_wanted);
    uint8_t enc[outputEsiCnt * symSize];

    /* Create encoding output symbol Program */
    size_t outWorkSize, outProgSize;
    RUN_NOFAIL(RqOutGetMemSizes(outputEsiCnt, &outWorkSize, &outProgSize));
    outWork = (RqOutWorkMem*) malloc(outWorkSize);
    outProgram = (RqOutProgram*) malloc(outProgSize);
    RUN_NOFAIL(RqOutInit(K, outWork, outWorkSize));
    for (int i = 0; i < outputEsiCnt; ++i)
        RUN_NOFAIL(RqOutAddIds(outWork, ESIs_wanted[i], 1));
    RUN_NOFAIL(RqOutCompile(outWork, outProgram, outProgSize));

    /* Iterate through the input file and transcode the data */
    int count =  0;
    while (count < length) {
        for (int i = 0; i < inputEsiCnt * symSize; ++i) {
            src[i] = 0x00;
        }

        ifs.read((char*)src, inputEsiCnt * symSize);
        if (!ifs) {
            fprintf(stderr, "Error: %s:%d: Unable to read enough bytes from file: %ld\n",
                    __FILE__, __LINE__, ifs.gcount());

            status = 1;
            DONE();
        }

        count += inputEsiCnt * symSize;

        /* Create intermediate block */
        uint8_t iblock[iblockSymCnt * symSize];
        RUN_NOFAIL(RqInterExecute(interProgram,         // interProgram
				  symSize,            // symbol size
				  src,                // symbol data
				  sizeof(src),        // sizeof symbol data
				  iblock,             // i-block
				  sizeof(iblock))); // size thereof

        /* Compute encoding/decoding */
        memset(enc, 0, sizeof(enc));
        RUN_NOFAIL(RqOutExecute(outProgram,
                                    symSize,
                                    iblock,
                                    enc,
                                    sizeof(enc)));

        /* End of transcode */

        /* Write out data to output file */
        ofs.write ((char*)(&enc[0]), sizeof(enc));
        if (!ofs.good() ) {
            fprintf(stderr,  "Error:%s:%d: Error while writing to output file\n",
                    __FILE__, __LINE__);

            status = 1;
            DONE();
        }
    }

    DONE();
#undef RUN_NOFAIL__INT
#undef RUN_NOFAIL
#undef DONE
}